

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O3

path * __thiscall
irr::io::CFileSystem::getFileDir(path *__return_storage_ptr__,CFileSystem *this,path *filename)

{
  uint uVar1;
  uint length;
  
  uVar1 = ::std::__cxx11::string::rfind((char)filename,0x2f);
  length = ::std::__cxx11::string::rfind((char)filename,0x5c);
  if ((int)length < (int)uVar1) {
    length = uVar1;
  }
  if (length < (uint)(filename->str)._M_string_length) {
    core::string<char>::subString(__return_storage_ptr__,filename,0,length,false);
  }
  else {
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    core::string<char>::operator=(__return_storage_ptr__,".");
  }
  return __return_storage_ptr__;
}

Assistant:

io::path CFileSystem::getFileDir(const io::path &filename) const
{
	// find last forward or backslash
	s32 lastSlash = filename.findLast('/');
	const s32 lastBackSlash = filename.findLast('\\');
	lastSlash = lastSlash > lastBackSlash ? lastSlash : lastBackSlash;

	if ((u32)lastSlash < filename.size())
		return filename.subString(0, lastSlash);
	else
		return _IRR_TEXT(".");
}